

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats_table_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  short *psVar2;
  undefined1 auVar3 [16];
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  parasail_result_t *ppVar19;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int16_t *ptr_06;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  __m128i *palVar26;
  long lVar27;
  short sVar28;
  short sVar29;
  uint uVar30;
  ulong uVar31;
  int16_t iVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  int32_t segNum;
  long lVar39;
  long lVar40;
  uint uVar41;
  short sVar42;
  long lVar43;
  short sVar44;
  undefined4 uVar46;
  short sVar60;
  short sVar62;
  short sVar64;
  short sVar67;
  short sVar69;
  undefined1 auVar48 [16];
  undefined4 uVar47;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  short sVar58;
  short sVar71;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ulong uVar66;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ulong uVar82;
  ushort uVar83;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar93;
  ushort uVar94;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  ushort uVar95;
  undefined1 auVar87 [16];
  ulong uVar92;
  short sVar96;
  undefined1 auVar97 [16];
  short sVar99;
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  short sVar103;
  ushort uVar104;
  short sVar106;
  ushort uVar107;
  short sVar108;
  ushort uVar109;
  short sVar110;
  ushort uVar111;
  short sVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  undefined1 auVar105 [16];
  ushort uVar116;
  short sVar118;
  short sVar119;
  short sVar120;
  short sVar121;
  short sVar122;
  short sVar123;
  undefined1 auVar117 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  ushort uVar129;
  ushort uVar130;
  ushort uVar131;
  ushort uVar132;
  ushort uVar133;
  ushort uVar134;
  ushort uVar135;
  ushort uVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i_16_t h;
  int local_334;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  long local_210;
  int local_208;
  short local_1f8;
  short sStack_1f6;
  short local_1e8;
  short sStack_1e6;
  ushort local_f8;
  ushort uStack_f6;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  longlong local_48;
  longlong lStack_40;
  longlong extraout_RDX;
  short sVar45;
  short sVar59;
  short sVar61;
  short sVar63;
  short sVar65;
  short sVar68;
  short sVar70;
  short sVar72;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_6();
      }
      else {
        uVar18 = profile->s1Len;
        if ((int)uVar18 < 1) {
          parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_4();
        }
        else {
          uVar34 = CONCAT44(0,s2Len);
          if (s2Len < 1) {
            parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_stats_table_scan_profile_sse41_128_16_cold_1();
          }
          else {
            iVar13 = uVar18 - 1;
            uVar92 = (ulong)uVar18 + 7;
            uVar31 = uVar92 >> 3;
            uVar30 = (uint)uVar31;
            iVar14 = iVar13 / (int)uVar30;
            uVar41 = iVar13 % (int)uVar30;
            iVar24 = -open;
            iVar21 = ppVar5->min;
            iVar35 = -iVar21;
            if (iVar21 != iVar24 && SBORROW4(iVar21,iVar24) == iVar21 + open < 0) {
              iVar35 = open;
            }
            pvVar6 = (profile->profile16).matches;
            iVar21 = ppVar5->max;
            pvVar7 = (profile->profile16).similar;
            ppVar19 = parasail_result_new_table3((uint)uVar92 & 0x7ffffff8,s2Len);
            if (ppVar19 != (parasail_result_t *)0x0) {
              local_278._0_4_ = uVar41;
              ppVar19->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar19->flag | 0x8230402;
              b = parasail_memalign___m128i(0x10,uVar31);
              b_00 = parasail_memalign___m128i(0x10,uVar31);
              b_01 = parasail_memalign___m128i(0x10,uVar31);
              b_02 = parasail_memalign___m128i(0x10,uVar31);
              ptr = parasail_memalign___m128i(0x10,uVar31);
              b_03 = parasail_memalign___m128i(0x10,uVar31);
              b_04 = parasail_memalign___m128i(0x10,uVar31);
              b_05 = parasail_memalign___m128i(0x10,uVar31);
              ptr_00 = parasail_memalign___m128i(0x10,uVar31);
              ptr_01 = parasail_memalign___m128i(0x10,uVar31);
              ptr_02 = parasail_memalign___m128i(0x10,uVar31);
              ptr_03 = parasail_memalign___m128i(0x10,uVar31);
              ptr_04 = parasail_memalign___m128i(0x10,uVar31);
              ptr_05 = parasail_memalign___m128i(0x10,uVar31);
              local_2a8._8_8_ = local_2a8._0_8_;
              local_2a8._0_8_ = uVar34;
              uVar82 = CONCAT44(0,s2Len + 1);
              local_288._8_8_ = local_288._0_8_;
              local_288._0_8_ = uVar82;
              ptr_06 = parasail_memalign_int16_t(0x10,uVar82);
              if ((ptr_06 != (int16_t *)0x0 &&
                  (ptr_05 != (__m128i *)0x0 &&
                  (ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0))) &&
                  ((ptr_02 != (__m128i *)0x0 &&
                   (ptr_01 != (__m128i *)0x0 && (ptr_00 != (__m128i *)0x0 && b_05 != (__m128i *)0x0)
                   )) && ((b_04 != (__m128i *)0x0 &&
                          (b_03 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) &&
                         ((b_02 != (__m128i *)0x0 && b_01 != (__m128i *)0x0) &&
                         (b_00 != (__m128i *)0x0 && b != (__m128i *)0x0))))) {
                iVar15 = s2Len + -1;
                uVar16 = 7 - iVar14;
                auVar48 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar46 = auVar48._0_4_;
                uVar33 = (ulong)(uint)gap;
                auVar48 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar47 = auVar48._0_4_;
                c[1]._0_4_ = iVar35 - 0x7fff;
                auVar49 = pshuflw(ZEXT416((uint)c[1]),ZEXT416((uint)c[1]),0);
                local_1f8 = auVar49._0_2_;
                sStack_1f6 = auVar49._2_2_;
                auVar48 = ZEXT416((uint)CONCAT62((int6)((ulong)pvVar6 >> 0x10),
                                                 0x7ffe - (short)iVar21));
                auVar50 = pshuflw(auVar48,auVar48,0);
                auVar48 = pshuflw(ZEXT416(uVar16),ZEXT416(uVar16),0);
                local_1e8 = auVar48._0_2_;
                sStack_1e6 = auVar48._2_2_;
                auVar73 = pshufb(ZEXT416(uVar30),_DAT_008d2ad0);
                auVar48 = pshufb(ZEXT416(-(uVar30 * gap)),_DAT_008d2ad0);
                auVar78 = paddsw(auVar48,ZEXT416((uint)c[1] & 0xffff));
                c[0] = uVar31;
                c[1]._4_4_ = 0;
                parasail_memset___m128i(b_03,c,uVar33);
                c_00[1] = extraout_RDX;
                c_00[0] = uVar31;
                parasail_memset___m128i(b_04,c_00,uVar33);
                c_01[1] = extraout_RDX_00;
                c_01[0] = uVar31;
                parasail_memset___m128i(b_05,c_01,uVar33);
                c_02[1] = extraout_RDX_01;
                c_02[0] = uVar31;
                parasail_memset___m128i(b,c_02,uVar33);
                c_03[1] = extraout_RDX_02;
                c_03[0] = uVar31;
                parasail_memset___m128i(b_00,c_03,uVar33);
                c_04[1] = extraout_RDX_03;
                c_04[0] = uVar31;
                parasail_memset___m128i(b_01,c_04,uVar33);
                c_05[1] = extraout_RDX_04;
                c_05[0] = uVar31;
                parasail_memset___m128i(b_02,c_05,uVar33);
                auVar48._4_4_ = uVar47;
                auVar48._0_4_ = uVar47;
                auVar48._8_4_ = uVar47;
                auVar48._12_4_ = uVar47;
                auVar100._4_4_ = uVar46;
                auVar100._0_4_ = uVar46;
                auVar100._8_4_ = uVar46;
                auVar100._12_4_ = uVar46;
                auVar79 = psubsw((undefined1  [16])0x0,auVar100);
                uVar17 = uVar30 - 1;
                lVar22 = (ulong)uVar17 << 4;
                auVar51 = pmovsxbw(auVar100,0x101010101010101);
                uVar33 = uVar31;
                auVar74 = auVar51;
                do {
                  *(undefined1 (*) [16])((long)*ptr_04 + lVar22) = auVar79;
                  *(undefined1 (*) [16])((long)*ptr_05 + lVar22) = auVar74;
                  auVar79 = psubsw(auVar79,auVar48);
                  auVar74 = paddsw(auVar74,auVar51);
                  lVar22 = lVar22 + -0x10;
                  iVar21 = (int)uVar33;
                  uVar25 = iVar21 - 1;
                  uVar33 = (ulong)uVar25;
                } while (uVar25 != 0 && 0 < iVar21);
                lVar22 = (long)iVar24;
                uVar33 = 0;
                do {
                  lVar39 = 0;
                  lVar36 = lVar22;
                  do {
                    lVar40 = lVar36;
                    if (s1_beg != 0) {
                      lVar40 = 0;
                    }
                    if (lVar40 < -0x7fff) {
                      lVar40 = -0x8000;
                    }
                    *(short *)((long)&local_48 + lVar39 * 2) = (short)lVar40;
                    lVar39 = lVar39 + 1;
                    lVar36 = lVar36 - uVar31 * (uint)gap;
                  } while (lVar39 != 8);
                  ptr[uVar33][0] = local_48;
                  ptr[uVar33][1] = lStack_40;
                  uVar33 = uVar33 + 1;
                  lVar22 = lVar22 - (ulong)(uint)gap;
                } while (uVar33 != uVar31);
                *ptr_06 = 0;
                uVar33 = 1;
                do {
                  iVar32 = -0x8000;
                  if (-0x8000 < iVar24) {
                    iVar32 = (int16_t)iVar24;
                  }
                  if (s2_beg != 0) {
                    iVar32 = 0;
                  }
                  ptr_06[uVar33] = iVar32;
                  uVar33 = uVar33 + 1;
                  iVar24 = iVar24 - gap;
                } while (uVar82 != uVar33);
                palVar26 = ptr + uVar41;
                uVar82 = 1;
                if (1 < s2Len) {
                  uVar82 = uVar34;
                }
                lVar20 = (ulong)(uVar30 + (uVar30 == 0)) << 4;
                lVar37 = uVar31 * uVar34;
                lVar22 = lVar37 * 4;
                lVar8 = lVar37 * 0x1c;
                lVar36 = lVar37 * 8;
                lVar38 = lVar37 * 0x10;
                auVar74._4_2_ = local_1f8;
                auVar74._0_4_ = auVar49._0_4_;
                auVar74._6_2_ = sStack_1f6;
                auVar74._8_2_ = local_1f8;
                auVar74._10_2_ = sStack_1f6;
                auVar74._12_2_ = local_1f8;
                auVar74._14_2_ = sStack_1f6;
                local_f8 = auVar50._0_2_;
                uStack_f6 = auVar50._2_2_;
                lVar39 = lVar37 * 0xc;
                lVar40 = lVar37 * 0x14;
                lVar37 = lVar37 * 0x18;
                local_210 = 0;
                uVar33 = 0;
                auVar50 = auVar74;
                auVar51 = auVar74;
                auVar79 = auVar74;
                auVar117 = auVar74;
                uVar129 = local_f8;
                uVar130 = uStack_f6;
                uVar131 = local_f8;
                uVar132 = uStack_f6;
                uVar133 = local_f8;
                uVar134 = uStack_f6;
                uVar135 = local_f8;
                uVar136 = uStack_f6;
                local_334 = iVar15;
                do {
                  uVar66 = ptr[uVar17][0];
                  uVar9 = b_03[uVar17][0];
                  uVar10 = b_04[uVar17][0];
                  uVar11 = b_05[uVar17][0];
                  auVar124._0_8_ = uVar9 << 0x10;
                  auVar124._8_8_ = b_03[uVar17][1] << 0x10 | uVar9 >> 0x30;
                  auVar140._0_8_ = uVar10 << 0x10;
                  auVar140._8_8_ = b_04[uVar17][1] << 0x10 | uVar10 >> 0x30;
                  auVar137._0_8_ = uVar11 << 0x10;
                  auVar137._8_8_ = b_05[uVar17][1] << 0x10 | uVar11 >> 0x30;
                  auVar128._8_8_ = ptr[uVar17][1] << 0x10 | uVar66 >> 0x30;
                  auVar128._0_8_ = uVar66 << 0x10 | (ulong)(ushort)ptr_06[uVar33];
                  lVar23 = uVar31 * (long)ppVar5->mapper[(byte)s2[uVar33]] * 0x10;
                  auVar125._4_2_ = local_1f8;
                  auVar125._0_4_ = auVar49._0_4_;
                  auVar125._6_2_ = sStack_1f6;
                  auVar125._8_2_ = local_1f8;
                  auVar125._10_2_ = sStack_1f6;
                  auVar125._12_2_ = local_1f8;
                  auVar125._14_2_ = sStack_1f6;
                  auVar75 = psubsw(auVar125,(undefined1  [16])*ptr_04);
                  local_298 = (undefined1  [16])0x0;
                  lVar43 = 0;
                  local_258 = (undefined1  [16])0x0;
                  local_268 = (undefined1  [16])0x0;
                  do {
                    auVar48 = *(undefined1 (*) [16])((long)*ptr + lVar43);
                    auVar3 = *(undefined1 (*) [16])((long)*b_03 + lVar43);
                    auVar100 = psubsw(auVar48,auVar100);
                    auVar105._4_4_ = uVar47;
                    auVar105._0_4_ = uVar47;
                    auVar105._8_4_ = uVar47;
                    auVar105._12_4_ = uVar47;
                    auVar105 = psubsw(*(undefined1 (*) [16])((long)*b + lVar43),auVar105);
                    sVar44 = auVar100._0_2_;
                    sVar103 = auVar105._0_2_;
                    auVar141._0_2_ = -(ushort)(sVar103 < sVar44);
                    sVar58 = auVar100._2_2_;
                    sVar106 = auVar105._2_2_;
                    auVar141._2_2_ = -(ushort)(sVar106 < sVar58);
                    sVar60 = auVar100._4_2_;
                    sVar108 = auVar105._4_2_;
                    auVar141._4_2_ = -(ushort)(sVar108 < sVar60);
                    sVar62 = auVar100._6_2_;
                    sVar110 = auVar105._6_2_;
                    auVar141._6_2_ = -(ushort)(sVar110 < sVar62);
                    sVar64 = auVar100._8_2_;
                    sVar112 = auVar105._8_2_;
                    auVar141._8_2_ = -(ushort)(sVar112 < sVar64);
                    sVar67 = auVar100._10_2_;
                    sVar28 = auVar105._10_2_;
                    auVar141._10_2_ = -(ushort)(sVar28 < sVar67);
                    sVar69 = auVar100._12_2_;
                    sVar29 = auVar105._12_2_;
                    sVar71 = auVar100._14_2_;
                    auVar141._12_2_ = -(ushort)(sVar29 < sVar69);
                    sVar42 = auVar105._14_2_;
                    auVar141._14_2_ = -(ushort)(sVar42 < sVar71);
                    auVar97 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar43),auVar3,auVar141)
                    ;
                    auVar105 = *(undefined1 (*) [16])((long)*b_04 + lVar43);
                    auVar80 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar43),auVar105,
                                       auVar141);
                    auVar54 = *(undefined1 (*) [16])((long)*b_05 + lVar43);
                    auVar141 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar43),auVar54,
                                        auVar141);
                    auVar100 = paddsw(auVar75,*(undefined1 (*) [16])((long)*ptr_04 + lVar43));
                    sVar45 = auVar100._0_2_;
                    sVar96 = auVar125._0_2_;
                    auVar52._0_2_ = -(ushort)(sVar96 < sVar45);
                    sVar59 = auVar100._2_2_;
                    sVar99 = auVar125._2_2_;
                    auVar52._2_2_ = -(ushort)(sVar99 < sVar59);
                    sVar61 = auVar100._4_2_;
                    sVar118 = auVar125._4_2_;
                    auVar52._4_2_ = -(ushort)(sVar118 < sVar61);
                    sVar63 = auVar100._6_2_;
                    sVar119 = auVar125._6_2_;
                    auVar52._6_2_ = -(ushort)(sVar119 < sVar63);
                    sVar65 = auVar100._8_2_;
                    sVar120 = auVar125._8_2_;
                    auVar52._8_2_ = -(ushort)(sVar120 < sVar65);
                    sVar68 = auVar100._10_2_;
                    sVar121 = auVar125._10_2_;
                    auVar52._10_2_ = -(ushort)(sVar121 < sVar68);
                    sVar70 = auVar100._12_2_;
                    sVar122 = auVar125._12_2_;
                    sVar72 = auVar100._14_2_;
                    auVar52._12_2_ = -(ushort)(sVar122 < sVar70);
                    sVar123 = auVar125._14_2_;
                    auVar52._14_2_ = -(ushort)(sVar123 < sVar72);
                    local_268 = pblendvb(local_268,local_288,auVar52);
                    local_258 = pblendvb(local_258,local_278,auVar52);
                    uVar104 = (ushort)(sVar103 < sVar44) * sVar44 |
                              (ushort)(sVar103 >= sVar44) * sVar103;
                    uVar107 = (ushort)(sVar106 < sVar58) * sVar58 |
                              (ushort)(sVar106 >= sVar58) * sVar106;
                    uVar109 = (ushort)(sVar108 < sVar60) * sVar60 |
                              (ushort)(sVar108 >= sVar60) * sVar108;
                    uVar111 = (ushort)(sVar110 < sVar62) * sVar62 |
                              (ushort)(sVar110 >= sVar62) * sVar110;
                    uVar113 = (ushort)(sVar112 < sVar64) * sVar64 |
                              (ushort)(sVar112 >= sVar64) * sVar112;
                    uVar114 = (ushort)(sVar28 < sVar67) * sVar67 |
                              (ushort)(sVar28 >= sVar67) * sVar28;
                    uVar115 = (ushort)(sVar29 < sVar69) * sVar69 |
                              (ushort)(sVar29 >= sVar69) * sVar29;
                    uVar116 = (ushort)(sVar42 < sVar71) * sVar71 |
                              (ushort)(sVar42 >= sVar71) * sVar42;
                    auVar125._0_2_ =
                         (ushort)(sVar45 < sVar96) * sVar96 | (ushort)(sVar45 >= sVar96) * sVar45;
                    auVar125._2_2_ =
                         (ushort)(sVar59 < sVar99) * sVar99 | (ushort)(sVar59 >= sVar99) * sVar59;
                    auVar125._4_2_ =
                         (ushort)(sVar61 < sVar118) * sVar118 | (ushort)(sVar61 >= sVar118) * sVar61
                    ;
                    auVar125._6_2_ =
                         (ushort)(sVar63 < sVar119) * sVar119 | (ushort)(sVar63 >= sVar119) * sVar63
                    ;
                    auVar125._8_2_ =
                         (ushort)(sVar65 < sVar120) * sVar120 | (ushort)(sVar65 >= sVar120) * sVar65
                    ;
                    auVar125._10_2_ =
                         (ushort)(sVar68 < sVar121) * sVar121 | (ushort)(sVar68 >= sVar121) * sVar68
                    ;
                    auVar125._12_2_ =
                         (ushort)(sVar70 < sVar122) * sVar122 | (ushort)(sVar70 >= sVar122) * sVar70
                    ;
                    auVar125._14_2_ =
                         (ushort)(sVar72 < sVar123) * sVar123 | (ushort)(sVar72 >= sVar123) * sVar72
                    ;
                    auVar100 = paddsw(local_2a8,*(undefined1 (*) [16])((long)*ptr_05 + lVar43));
                    local_298 = pblendvb(local_298,auVar100,auVar52);
                    auVar128 = paddsw(auVar128,*(undefined1 (*) [16])
                                                ((long)pvVar4 + lVar43 + lVar23));
                    auVar124 = paddsw(auVar124,*(undefined1 (*) [16])
                                                ((long)pvVar6 + lVar43 + lVar23));
                    auVar140 = paddsw(auVar140,*(undefined1 (*) [16])
                                                ((long)pvVar7 + lVar43 + lVar23));
                    sVar44 = auVar128._0_2_;
                    auVar53._0_2_ = -(ushort)(sVar44 < (short)uVar104);
                    sVar45 = auVar128._2_2_;
                    auVar53._2_2_ = -(ushort)(sVar45 < (short)uVar107);
                    sVar58 = auVar128._4_2_;
                    auVar53._4_2_ = -(ushort)(sVar58 < (short)uVar109);
                    sVar59 = auVar128._6_2_;
                    auVar53._6_2_ = -(ushort)(sVar59 < (short)uVar111);
                    sVar60 = auVar128._8_2_;
                    auVar53._8_2_ = -(ushort)(sVar60 < (short)uVar113);
                    sVar61 = auVar128._10_2_;
                    auVar53._10_2_ = -(ushort)(sVar61 < (short)uVar114);
                    sVar62 = auVar128._12_2_;
                    auVar53._12_2_ = -(ushort)(sVar62 < (short)uVar115);
                    sVar63 = auVar128._14_2_;
                    auVar53._14_2_ = -(ushort)(sVar63 < (short)uVar116);
                    local_288 = pblendvb(auVar124,auVar97,auVar53);
                    local_278 = pblendvb(auVar140,auVar80,auVar53);
                    auVar100 = pmovsxbw(local_298,0x101010101010101);
                    auVar75 = paddsw(auVar141,auVar100);
                    auVar100 = paddsw(auVar137,auVar100);
                    local_2a8 = pblendvb(auVar100,auVar75,auVar53);
                    puVar1 = (ushort *)((long)*b + lVar43);
                    *puVar1 = uVar104;
                    puVar1[1] = uVar107;
                    puVar1[2] = uVar109;
                    puVar1[3] = uVar111;
                    puVar1[4] = uVar113;
                    puVar1[5] = uVar114;
                    puVar1[6] = uVar115;
                    puVar1[7] = uVar116;
                    *(undefined1 (*) [16])((long)*b_00 + lVar43) = auVar97;
                    *(undefined1 (*) [16])((long)*b_01 + lVar43) = auVar80;
                    *(undefined1 (*) [16])((long)*b_02 + lVar43) = auVar75;
                    uVar104 = (ushort)((short)uVar104 < sVar44) * sVar44 |
                              ((short)uVar104 >= sVar44) * uVar104;
                    uVar107 = (ushort)((short)uVar107 < sVar45) * sVar45 |
                              ((short)uVar107 >= sVar45) * uVar107;
                    uVar109 = (ushort)((short)uVar109 < sVar58) * sVar58 |
                              ((short)uVar109 >= sVar58) * uVar109;
                    uVar111 = (ushort)((short)uVar111 < sVar59) * sVar59 |
                              ((short)uVar111 >= sVar59) * uVar111;
                    auVar75._0_8_ = CONCAT26(uVar111,CONCAT24(uVar109,CONCAT22(uVar107,uVar104)));
                    auVar75._8_2_ =
                         (ushort)((short)uVar113 < sVar60) * sVar60 |
                         ((short)uVar113 >= sVar60) * uVar113;
                    auVar75._10_2_ =
                         (ushort)((short)uVar114 < sVar61) * sVar61 |
                         ((short)uVar114 >= sVar61) * uVar114;
                    auVar75._12_2_ =
                         (ushort)((short)uVar115 < sVar62) * sVar62 |
                         ((short)uVar115 >= sVar62) * uVar115;
                    auVar75._14_2_ =
                         (ushort)((short)uVar116 < sVar63) * sVar63 |
                         ((short)uVar116 >= sVar63) * uVar116;
                    *(undefined1 (*) [16])((long)*ptr + lVar43) = auVar128;
                    *(undefined1 (*) [16])((long)*b_03 + lVar43) = auVar124;
                    *(undefined1 (*) [16])((long)*b_04 + lVar43) = auVar140;
                    *(undefined1 (*) [16])((long)*b_05 + lVar43) = auVar100;
                    lVar43 = lVar43 + 0x10;
                    auVar137 = auVar54;
                    auVar124 = auVar3;
                    auVar128 = auVar48;
                    auVar140 = auVar105;
                  } while (lVar20 != lVar43);
                  auVar3._4_4_ = uVar47;
                  auVar3._0_4_ = uVar47;
                  auVar3._8_4_ = uVar47;
                  auVar3._12_4_ = uVar47;
                  lVar23 = local_288._8_8_;
                  uVar66 = local_288._0_8_;
                  local_288._0_8_ = uVar66 << 0x10;
                  local_288._8_8_ = lVar23 << 0x10 | uVar66 >> 0x30;
                  lVar23 = local_278._8_8_;
                  uVar66 = local_278._0_8_;
                  local_278._0_8_ = uVar66 << 0x10;
                  local_278._8_8_ = lVar23 << 0x10 | uVar66 >> 0x30;
                  lVar23 = local_2a8._8_8_;
                  uVar66 = local_2a8._0_8_;
                  local_2a8._0_8_ = uVar66 << 0x10;
                  local_2a8._8_8_ = lVar23 << 0x10 | uVar66 >> 0x30;
                  auVar80._8_8_ = auVar75._8_8_ << 0x10 | (ulong)uVar111;
                  uVar113 = ptr_06[uVar33 + 1];
                  auVar80._0_8_ = auVar75._0_8_ << 0x10 | (ulong)uVar113;
                  uVar66 = uVar33 + 1;
                  auVar48 = paddsw((undefined1  [16])*ptr_04,auVar80);
                  sVar44 = auVar48._0_2_;
                  auVar54._0_2_ = -(ushort)(sVar44 < (short)auVar125._0_2_);
                  sVar45 = auVar48._2_2_;
                  auVar54._2_2_ = -(ushort)(sVar45 < (short)auVar125._2_2_);
                  sVar58 = auVar48._4_2_;
                  auVar54._4_2_ = -(ushort)(sVar58 < (short)auVar125._4_2_);
                  sVar59 = auVar48._6_2_;
                  auVar54._6_2_ = -(ushort)(sVar59 < (short)auVar125._6_2_);
                  sVar60 = auVar48._8_2_;
                  auVar54._8_2_ = -(ushort)(sVar60 < (short)auVar125._8_2_);
                  sVar61 = auVar48._10_2_;
                  auVar54._10_2_ = -(ushort)(sVar61 < (short)auVar125._10_2_);
                  sVar62 = auVar48._12_2_;
                  auVar54._12_2_ = -(ushort)(sVar62 < (short)auVar125._12_2_);
                  sVar63 = auVar48._14_2_;
                  auVar54._14_2_ = -(ushort)(sVar63 < (short)auVar125._14_2_);
                  auVar97._0_2_ =
                       (sVar44 < (short)auVar125._0_2_) * auVar125._0_2_ |
                       (ushort)(sVar44 >= (short)auVar125._0_2_) * sVar44;
                  auVar97._2_2_ =
                       (sVar45 < (short)auVar125._2_2_) * auVar125._2_2_ |
                       (ushort)(sVar45 >= (short)auVar125._2_2_) * sVar45;
                  auVar97._4_2_ =
                       (sVar58 < (short)auVar125._4_2_) * auVar125._4_2_ |
                       (ushort)(sVar58 >= (short)auVar125._4_2_) * sVar58;
                  auVar97._6_2_ =
                       (sVar59 < (short)auVar125._6_2_) * auVar125._6_2_ |
                       (ushort)(sVar59 >= (short)auVar125._6_2_) * sVar59;
                  auVar97._8_2_ =
                       (sVar60 < (short)auVar125._8_2_) * auVar125._8_2_ |
                       (ushort)(sVar60 >= (short)auVar125._8_2_) * sVar60;
                  auVar97._10_2_ =
                       (sVar61 < (short)auVar125._10_2_) * auVar125._10_2_ |
                       (ushort)(sVar61 >= (short)auVar125._10_2_) * sVar61;
                  auVar97._12_2_ =
                       (sVar62 < (short)auVar125._12_2_) * auVar125._12_2_ |
                       (ushort)(sVar62 >= (short)auVar125._12_2_) * sVar62;
                  auVar97._14_2_ =
                       (sVar63 < (short)auVar125._14_2_) * auVar125._14_2_ |
                       (ushort)(sVar63 >= (short)auVar125._14_2_) * sVar63;
                  auVar137 = pblendvb(local_288,local_268,auVar54);
                  auVar48 = pblendvb(local_278,local_258,auVar54);
                  auVar125 = paddsw((undefined1  [16])*ptr_05,local_2a8);
                  auVar125 = pblendvb(auVar125,local_298,auVar54);
                  iVar21 = 6;
                  do {
                    auVar138._0_8_ = auVar137._0_8_ << 0x10;
                    auVar138._8_8_ = auVar137._8_8_ << 0x10 | auVar137._0_8_ >> 0x30;
                    auVar84._0_8_ = auVar97._0_8_ << 0x10;
                    auVar84._8_8_ = auVar97._8_8_ << 0x10 | auVar97._0_8_ >> 0x30;
                    auVar124 = paddsw(auVar84,auVar78);
                    sVar44 = auVar97._0_2_;
                    sVar64 = auVar124._0_2_;
                    auVar55._0_2_ = -(ushort)(sVar64 < sVar44);
                    sVar45 = auVar97._2_2_;
                    sVar65 = auVar124._2_2_;
                    auVar55._2_2_ = -(ushort)(sVar65 < sVar45);
                    sVar58 = auVar97._4_2_;
                    sVar67 = auVar124._4_2_;
                    auVar55._4_2_ = -(ushort)(sVar67 < sVar58);
                    sVar59 = auVar97._6_2_;
                    sVar68 = auVar124._6_2_;
                    auVar55._6_2_ = -(ushort)(sVar68 < sVar59);
                    sVar60 = auVar97._8_2_;
                    sVar69 = auVar124._8_2_;
                    auVar55._8_2_ = -(ushort)(sVar69 < sVar60);
                    sVar61 = auVar97._10_2_;
                    sVar70 = auVar124._10_2_;
                    auVar55._10_2_ = -(ushort)(sVar70 < sVar61);
                    sVar62 = auVar97._12_2_;
                    sVar71 = auVar124._12_2_;
                    sVar63 = auVar97._14_2_;
                    auVar55._12_2_ = -(ushort)(sVar71 < sVar62);
                    sVar72 = auVar124._14_2_;
                    auVar55._14_2_ = -(ushort)(sVar72 < sVar63);
                    auVar137 = pblendvb(auVar138,auVar137,auVar55);
                    auVar101._0_8_ = auVar48._0_8_ << 0x10;
                    auVar101._8_8_ = auVar48._8_8_ << 0x10 | auVar48._0_8_ >> 0x30;
                    auVar126._0_8_ = auVar125._0_8_ << 0x10;
                    auVar126._8_8_ = auVar125._8_8_ << 0x10 | auVar125._0_8_ >> 0x30;
                    auVar124 = paddsw(auVar126,auVar73);
                    uVar114 = (ushort)(sVar68 < sVar59) * sVar59 |
                              (ushort)(sVar68 >= sVar59) * sVar68;
                    auVar97._0_8_ =
                         CONCAT26(uVar114,CONCAT24((ushort)(sVar67 < sVar58) * sVar58 |
                                                   (ushort)(sVar67 >= sVar58) * sVar67,
                                                   CONCAT22((ushort)(sVar65 < sVar45) * sVar45 |
                                                            (ushort)(sVar65 >= sVar45) * sVar65,
                                                            (ushort)(sVar64 < sVar44) * sVar44 |
                                                            (ushort)(sVar64 >= sVar44) * sVar64)));
                    auVar97._8_2_ =
                         (ushort)(sVar69 < sVar60) * sVar60 | (ushort)(sVar69 >= sVar60) * sVar69;
                    auVar97._10_2_ =
                         (ushort)(sVar70 < sVar61) * sVar61 | (ushort)(sVar70 >= sVar61) * sVar70;
                    auVar97._12_2_ =
                         (ushort)(sVar71 < sVar62) * sVar62 | (ushort)(sVar71 >= sVar62) * sVar71;
                    auVar97._14_2_ =
                         (ushort)(sVar72 < sVar63) * sVar63 | (ushort)(sVar72 >= sVar63) * sVar72;
                    auVar48 = pblendvb(auVar101,auVar48,auVar55);
                    auVar125 = pblendvb(auVar124,auVar125,auVar55);
                    iVar21 = iVar21 + -1;
                  } while (iVar21 != 0);
                  auVar139._0_8_ = auVar137._0_8_ << 0x10;
                  auVar139._8_8_ = auVar137._8_8_ << 0x10 | auVar137._0_8_ >> 0x30;
                  auVar102._0_8_ = auVar48._0_8_ << 0x10;
                  auVar102._8_8_ = auVar48._8_8_ << 0x10 | auVar48._0_8_ >> 0x30;
                  auVar127._0_8_ = auVar125._0_8_ << 0x10;
                  auVar127._8_8_ = auVar125._8_8_ << 0x10 | auVar125._0_8_ >> 0x30;
                  auVar85._0_8_ = auVar97._0_8_ << 0x10;
                  auVar85._8_8_ = auVar97._8_8_ << 0x10 | (ulong)uVar114;
                  auVar86 = paddsw(auVar85,ZEXT416((uint)c[1] & 0xffff));
                  sVar44 = auVar86._0_2_;
                  auVar56._0_2_ = -(ushort)((short)uVar113 < sVar44);
                  sVar45 = auVar86._2_2_;
                  auVar56._2_2_ = -(ushort)((short)uVar104 < sVar45);
                  sVar58 = auVar86._4_2_;
                  auVar56._4_2_ = -(ushort)((short)uVar107 < sVar58);
                  sVar59 = auVar86._6_2_;
                  auVar56._6_2_ = -(ushort)((short)uVar109 < sVar59);
                  sVar60 = auVar86._8_2_;
                  auVar56._8_2_ = -(ushort)((short)uVar111 < sVar60);
                  sVar61 = auVar86._10_2_;
                  auVar56._10_2_ = -(ushort)((short)auVar75._8_2_ < sVar61);
                  sVar62 = auVar86._12_2_;
                  sVar63 = auVar86._14_2_;
                  auVar56._12_2_ = -(ushort)((short)auVar75._10_2_ < sVar62);
                  auVar56._14_2_ = -(ushort)((short)auVar75._12_2_ < sVar63);
                  auVar76._0_2_ =
                       (ushort)((short)uVar113 < sVar44) * sVar44 |
                       ((short)uVar113 >= sVar44) * uVar113;
                  auVar76._2_2_ =
                       (ushort)((short)uVar104 < sVar45) * sVar45 |
                       ((short)uVar104 >= sVar45) * uVar104;
                  auVar76._4_2_ =
                       (ushort)((short)uVar107 < sVar58) * sVar58 |
                       ((short)uVar107 >= sVar58) * uVar107;
                  auVar76._6_2_ =
                       (ushort)((short)uVar109 < sVar59) * sVar59 |
                       ((short)uVar109 >= sVar59) * uVar109;
                  auVar76._8_2_ =
                       (ushort)((short)uVar111 < sVar60) * sVar60 |
                       ((short)uVar111 >= sVar60) * uVar111;
                  auVar76._10_2_ =
                       (ushort)((short)auVar75._8_2_ < sVar61) * sVar61 |
                       ((short)auVar75._8_2_ >= sVar61) * auVar75._8_2_;
                  auVar76._12_2_ =
                       (ushort)((short)auVar75._10_2_ < sVar62) * sVar62 |
                       ((short)auVar75._10_2_ >= sVar62) * auVar75._10_2_;
                  auVar76._14_2_ =
                       (ushort)((short)auVar75._12_2_ < sVar63) * sVar63 |
                       ((short)auVar75._12_2_ >= sVar63) * auVar75._12_2_;
                  auVar137 = pblendvb(local_288,auVar139,auVar56);
                  auVar124 = pblendvb(local_278,auVar102,auVar56);
                  auVar48 = pblendvb(local_2a8,auVar127,auVar56);
                  lVar43 = 0;
                  auVar125 = pmovsxbw(auVar78,0x101010101010101);
                  lVar23 = local_210;
                  do {
                    auVar128 = psubsw(auVar76,auVar100);
                    auVar140 = psubsw(auVar86,auVar3);
                    sVar44 = auVar128._0_2_;
                    sVar64 = auVar140._0_2_;
                    auVar77._0_2_ = -(ushort)(sVar64 < sVar44);
                    sVar45 = auVar128._2_2_;
                    sVar65 = auVar140._2_2_;
                    auVar77._2_2_ = -(ushort)(sVar65 < sVar45);
                    sVar58 = auVar128._4_2_;
                    sVar67 = auVar140._4_2_;
                    auVar77._4_2_ = -(ushort)(sVar67 < sVar58);
                    sVar59 = auVar128._6_2_;
                    sVar68 = auVar140._6_2_;
                    auVar77._6_2_ = -(ushort)(sVar68 < sVar59);
                    sVar60 = auVar128._8_2_;
                    sVar69 = auVar140._8_2_;
                    auVar77._8_2_ = -(ushort)(sVar69 < sVar60);
                    sVar61 = auVar128._10_2_;
                    sVar70 = auVar140._10_2_;
                    auVar77._10_2_ = -(ushort)(sVar70 < sVar61);
                    sVar62 = auVar128._12_2_;
                    sVar71 = auVar140._12_2_;
                    sVar63 = auVar128._14_2_;
                    auVar77._12_2_ = -(ushort)(sVar71 < sVar62);
                    sVar72 = auVar140._14_2_;
                    auVar77._14_2_ = -(ushort)(sVar72 < sVar63);
                    auVar139 = pblendvb(auVar139,auVar137,auVar77);
                    auVar102 = pblendvb(auVar102,auVar124,auVar77);
                    puVar1 = (ushort *)((long)*ptr + lVar43);
                    uVar104 = *puVar1;
                    uVar107 = puVar1[1];
                    uVar109 = puVar1[2];
                    uVar111 = puVar1[3];
                    uVar113 = puVar1[4];
                    uVar114 = puVar1[5];
                    uVar115 = puVar1[6];
                    uVar116 = puVar1[7];
                    auVar48 = pblendvb(auVar127,auVar48,auVar77);
                    auVar86._0_2_ =
                         (ushort)(sVar44 < sVar64) * sVar64 | (ushort)(sVar44 >= sVar64) * sVar44;
                    auVar86._2_2_ =
                         (ushort)(sVar45 < sVar65) * sVar65 | (ushort)(sVar45 >= sVar65) * sVar45;
                    auVar86._4_2_ =
                         (ushort)(sVar58 < sVar67) * sVar67 | (ushort)(sVar58 >= sVar67) * sVar58;
                    auVar86._6_2_ =
                         (ushort)(sVar59 < sVar68) * sVar68 | (ushort)(sVar59 >= sVar68) * sVar59;
                    auVar86._8_2_ =
                         (ushort)(sVar60 < sVar69) * sVar69 | (ushort)(sVar60 >= sVar69) * sVar60;
                    auVar86._10_2_ =
                         (ushort)(sVar61 < sVar70) * sVar70 | (ushort)(sVar61 >= sVar70) * sVar61;
                    auVar86._12_2_ =
                         (ushort)(sVar62 < sVar71) * sVar71 | (ushort)(sVar62 >= sVar71) * sVar62;
                    auVar86._14_2_ =
                         (ushort)(sVar63 < sVar72) * sVar72 | (ushort)(sVar63 >= sVar72) * sVar63;
                    psVar2 = (short *)((long)*b + lVar43);
                    sVar44 = *psVar2;
                    sVar45 = psVar2[1];
                    sVar58 = psVar2[2];
                    sVar59 = psVar2[3];
                    sVar60 = psVar2[4];
                    sVar61 = psVar2[5];
                    sVar62 = psVar2[6];
                    sVar63 = psVar2[7];
                    uVar83 = (sVar44 < (short)uVar104) * uVar104 |
                             (ushort)(sVar44 >= (short)uVar104) * sVar44;
                    uVar88 = (sVar45 < (short)uVar107) * uVar107 |
                             (ushort)(sVar45 >= (short)uVar107) * sVar45;
                    uVar89 = (sVar58 < (short)uVar109) * uVar109 |
                             (ushort)(sVar58 >= (short)uVar109) * sVar58;
                    uVar90 = (sVar59 < (short)uVar111) * uVar111 |
                             (ushort)(sVar59 >= (short)uVar111) * sVar59;
                    uVar91 = (sVar60 < (short)uVar113) * uVar113 |
                             (ushort)(sVar60 >= (short)uVar113) * sVar60;
                    uVar93 = (sVar61 < (short)uVar114) * uVar114 |
                             (ushort)(sVar61 >= (short)uVar114) * sVar61;
                    uVar94 = (sVar62 < (short)uVar115) * uVar115 |
                             (ushort)(sVar62 >= (short)uVar115) * sVar62;
                    uVar95 = (sVar63 < (short)uVar116) * uVar116 |
                             (ushort)(sVar63 >= (short)uVar116) * sVar63;
                    auVar76._0_2_ =
                         ((short)uVar83 < (short)auVar86._0_2_) * auVar86._0_2_ |
                         ((short)uVar83 >= (short)auVar86._0_2_) * uVar83;
                    auVar76._2_2_ =
                         ((short)uVar88 < (short)auVar86._2_2_) * auVar86._2_2_ |
                         ((short)uVar88 >= (short)auVar86._2_2_) * uVar88;
                    auVar76._4_2_ =
                         ((short)uVar89 < (short)auVar86._4_2_) * auVar86._4_2_ |
                         ((short)uVar89 >= (short)auVar86._4_2_) * uVar89;
                    auVar76._6_2_ =
                         ((short)uVar90 < (short)auVar86._6_2_) * auVar86._6_2_ |
                         ((short)uVar90 >= (short)auVar86._6_2_) * uVar90;
                    auVar76._8_2_ =
                         ((short)uVar91 < (short)auVar86._8_2_) * auVar86._8_2_ |
                         ((short)uVar91 >= (short)auVar86._8_2_) * uVar91;
                    auVar76._10_2_ =
                         ((short)uVar93 < (short)auVar86._10_2_) * auVar86._10_2_ |
                         ((short)uVar93 >= (short)auVar86._10_2_) * uVar93;
                    auVar76._12_2_ =
                         ((short)uVar94 < (short)auVar86._12_2_) * auVar86._12_2_ |
                         ((short)uVar94 >= (short)auVar86._12_2_) * uVar94;
                    auVar76._14_2_ =
                         ((short)uVar95 < (short)auVar86._14_2_) * auVar86._14_2_ |
                         ((short)uVar95 >= (short)auVar86._14_2_) * uVar95;
                    auVar87._0_2_ = -(ushort)((short)auVar86._0_2_ < (short)uVar83);
                    auVar87._2_2_ = -(ushort)((short)auVar86._2_2_ < (short)uVar88);
                    auVar87._4_2_ = -(ushort)((short)auVar86._4_2_ < (short)uVar89);
                    auVar87._6_2_ = -(ushort)((short)auVar86._6_2_ < (short)uVar90);
                    auVar87._8_2_ = -(ushort)((short)auVar86._8_2_ < (short)uVar91);
                    auVar87._10_2_ = -(ushort)((short)auVar86._10_2_ < (short)uVar93);
                    auVar87._12_2_ = -(ushort)((short)auVar86._12_2_ < (short)uVar94);
                    auVar87._14_2_ = -(ushort)((short)auVar86._14_2_ < (short)uVar95);
                    auVar81._0_2_ = -(ushort)(uVar104 == auVar76._0_2_);
                    auVar81._2_2_ = -(ushort)(uVar107 == auVar76._2_2_);
                    auVar81._4_2_ = -(ushort)(uVar109 == auVar76._4_2_);
                    auVar81._6_2_ = -(ushort)(uVar111 == auVar76._6_2_);
                    auVar81._8_2_ = -(ushort)(uVar113 == auVar76._8_2_);
                    auVar81._10_2_ = -(ushort)(uVar114 == auVar76._10_2_);
                    auVar81._12_2_ = -(ushort)(uVar115 == auVar76._12_2_);
                    auVar81._14_2_ = -(ushort)(uVar116 == auVar76._14_2_);
                    auVar137 = pblendvb(auVar139,*(undefined1 (*) [16])((long)*b_00 + lVar43),
                                        auVar87);
                    auVar137 = pblendvb(auVar137,*(undefined1 (*) [16])((long)*b_03 + lVar43),
                                        auVar81);
                    auVar127 = paddsw(auVar48,auVar125);
                    auVar48 = pblendvb(auVar102,*(undefined1 (*) [16])((long)*b_01 + lVar43),auVar87
                                      );
                    auVar124 = pblendvb(auVar48,*(undefined1 (*) [16])((long)*b_04 + lVar43),auVar81
                                       );
                    auVar48 = pblendvb(auVar127,*(undefined1 (*) [16])((long)*b_02 + lVar43),auVar87
                                      );
                    auVar48 = pblendvb(auVar48,*(undefined1 (*) [16])((long)*b_05 + lVar43),auVar81)
                    ;
                    *(undefined1 (*) [16])((long)*ptr + lVar43) = auVar76;
                    *(undefined1 (*) [16])((long)*b_03 + lVar43) = auVar137;
                    *(undefined1 (*) [16])((long)*b_04 + lVar43) = auVar124;
                    *(undefined1 (*) [16])((long)*b_05 + lVar43) = auVar48;
                    lVar27 = *((ppVar19->field_4).trace)->trace_del_table;
                    *(int *)(lVar27 + lVar23) = (int)(short)auVar76._0_2_;
                    lVar27 = lVar27 + lVar23;
                    *(int *)(lVar22 + lVar27) = (int)(short)auVar76._2_2_;
                    *(int *)(lVar36 + lVar27) = (int)(short)auVar76._4_2_;
                    *(int *)(lVar39 + lVar27) = (int)(short)auVar76._6_2_;
                    *(int *)(lVar38 + lVar27) = (int)(short)auVar76._8_2_;
                    *(int *)(lVar40 + lVar27) = (int)(short)auVar76._10_2_;
                    *(int *)(lVar37 + lVar27) = (int)(short)auVar76._12_2_;
                    *(int *)(lVar8 + lVar27) = (int)(short)auVar76._14_2_;
                    lVar27 = *(long *)((long)((ppVar19->field_4).trace)->trace_del_table + 8);
                    sVar42 = auVar137._0_2_;
                    sVar44 = auVar137._2_2_;
                    *(int *)(lVar27 + lVar23) = (int)sVar42;
                    sVar45 = auVar137._4_2_;
                    lVar27 = lVar27 + lVar23;
                    *(int *)(lVar22 + lVar27) = (int)sVar44;
                    sVar58 = auVar137._6_2_;
                    *(int *)(lVar36 + lVar27) = (int)sVar45;
                    sVar59 = auVar137._8_2_;
                    *(int *)(lVar39 + lVar27) = (int)sVar58;
                    sVar60 = auVar137._10_2_;
                    *(int *)(lVar38 + lVar27) = (int)sVar59;
                    sVar61 = auVar137._12_2_;
                    *(int *)(lVar40 + lVar27) = (int)sVar60;
                    sVar62 = auVar137._14_2_;
                    *(int *)(lVar37 + lVar27) = (int)sVar61;
                    *(int *)(lVar8 + lVar27) = (int)sVar62;
                    lVar27 = *(long *)((long)((ppVar19->field_4).trace)->trace_del_table + 0x10);
                    sVar28 = auVar124._0_2_;
                    *(int *)(lVar27 + lVar23) = (int)sVar28;
                    sVar63 = auVar124._2_2_;
                    lVar27 = lVar27 + lVar23;
                    *(int *)(lVar22 + lVar27) = (int)sVar63;
                    sVar64 = auVar124._4_2_;
                    *(int *)(lVar36 + lVar27) = (int)sVar64;
                    sVar65 = auVar124._6_2_;
                    *(int *)(lVar39 + lVar27) = (int)sVar65;
                    sVar67 = auVar124._8_2_;
                    *(int *)(lVar38 + lVar27) = (int)sVar67;
                    sVar68 = auVar124._10_2_;
                    *(int *)(lVar40 + lVar27) = (int)sVar68;
                    sVar69 = auVar124._12_2_;
                    *(int *)(lVar37 + lVar27) = (int)sVar69;
                    sVar70 = auVar124._14_2_;
                    *(int *)(lVar8 + lVar27) = (int)sVar70;
                    lVar27 = *(long *)((long)((ppVar19->field_4).trace)->trace_del_table + 0x18);
                    sVar29 = auVar48._0_2_;
                    *(int *)(lVar27 + lVar23) = (int)sVar29;
                    sVar71 = auVar48._2_2_;
                    lVar27 = lVar27 + lVar23;
                    *(int *)(lVar22 + lVar27) = (int)sVar71;
                    sVar72 = auVar48._4_2_;
                    *(int *)(lVar36 + lVar27) = (int)sVar72;
                    sVar103 = auVar48._6_2_;
                    *(int *)(lVar39 + lVar27) = (int)sVar103;
                    sVar106 = auVar48._8_2_;
                    *(int *)(lVar38 + lVar27) = (int)sVar106;
                    sVar108 = auVar48._10_2_;
                    *(int *)(lVar40 + lVar27) = (int)sVar108;
                    sVar110 = auVar48._12_2_;
                    *(int *)(lVar37 + lVar27) = (int)sVar110;
                    sVar112 = auVar48._14_2_;
                    *(int *)(lVar8 + lVar27) = (int)sVar112;
                    uVar129 = ((short)auVar76._0_2_ < (short)uVar129) * auVar76._0_2_ |
                              ((short)auVar76._0_2_ >= (short)uVar129) * uVar129;
                    uVar130 = ((short)auVar76._2_2_ < (short)uVar130) * auVar76._2_2_ |
                              ((short)auVar76._2_2_ >= (short)uVar130) * uVar130;
                    uVar131 = ((short)auVar76._4_2_ < (short)uVar131) * auVar76._4_2_ |
                              ((short)auVar76._4_2_ >= (short)uVar131) * uVar131;
                    uVar132 = ((short)auVar76._6_2_ < (short)uVar132) * auVar76._6_2_ |
                              ((short)auVar76._6_2_ >= (short)uVar132) * uVar132;
                    uVar133 = ((short)auVar76._8_2_ < (short)uVar133) * auVar76._8_2_ |
                              ((short)auVar76._8_2_ >= (short)uVar133) * uVar133;
                    uVar134 = ((short)auVar76._10_2_ < (short)uVar134) * auVar76._10_2_ |
                              ((short)auVar76._10_2_ >= (short)uVar134) * uVar134;
                    uVar135 = ((short)auVar76._12_2_ < (short)uVar135) * auVar76._12_2_ |
                              ((short)auVar76._12_2_ >= (short)uVar135) * uVar135;
                    uVar136 = ((short)auVar76._14_2_ < (short)uVar136) * auVar76._14_2_ |
                              ((short)auVar76._14_2_ >= (short)uVar136) * uVar136;
                    sVar96 = auVar51._0_2_;
                    uVar104 = (sVar96 < (short)auVar76._0_2_) * auVar76._0_2_ |
                              (ushort)(sVar96 >= (short)auVar76._0_2_) * sVar96;
                    sVar96 = auVar51._2_2_;
                    uVar107 = (sVar96 < (short)auVar76._2_2_) * auVar76._2_2_ |
                              (ushort)(sVar96 >= (short)auVar76._2_2_) * sVar96;
                    sVar96 = auVar51._4_2_;
                    uVar109 = (sVar96 < (short)auVar76._4_2_) * auVar76._4_2_ |
                              (ushort)(sVar96 >= (short)auVar76._4_2_) * sVar96;
                    sVar96 = auVar51._6_2_;
                    uVar111 = (sVar96 < (short)auVar76._6_2_) * auVar76._6_2_ |
                              (ushort)(sVar96 >= (short)auVar76._6_2_) * sVar96;
                    sVar96 = auVar51._8_2_;
                    uVar113 = (sVar96 < (short)auVar76._8_2_) * auVar76._8_2_ |
                              (ushort)(sVar96 >= (short)auVar76._8_2_) * sVar96;
                    sVar96 = auVar51._10_2_;
                    uVar114 = (sVar96 < (short)auVar76._10_2_) * auVar76._10_2_ |
                              (ushort)(sVar96 >= (short)auVar76._10_2_) * sVar96;
                    sVar96 = auVar51._12_2_;
                    sVar99 = auVar51._14_2_;
                    uVar115 = (sVar96 < (short)auVar76._12_2_) * auVar76._12_2_ |
                              (ushort)(sVar96 >= (short)auVar76._12_2_) * sVar96;
                    uVar116 = (sVar99 < (short)auVar76._14_2_) * auVar76._14_2_ |
                              (ushort)(sVar99 >= (short)auVar76._14_2_) * sVar99;
                    uVar104 = (ushort)((short)uVar104 < sVar42) * sVar42 |
                              ((short)uVar104 >= sVar42) * uVar104;
                    uVar107 = (ushort)((short)uVar107 < sVar44) * sVar44 |
                              ((short)uVar107 >= sVar44) * uVar107;
                    uVar109 = (ushort)((short)uVar109 < sVar45) * sVar45 |
                              ((short)uVar109 >= sVar45) * uVar109;
                    uVar111 = (ushort)((short)uVar111 < sVar58) * sVar58 |
                              ((short)uVar111 >= sVar58) * uVar111;
                    uVar113 = (ushort)((short)uVar113 < sVar59) * sVar59 |
                              ((short)uVar113 >= sVar59) * uVar113;
                    uVar114 = (ushort)((short)uVar114 < sVar60) * sVar60 |
                              ((short)uVar114 >= sVar60) * uVar114;
                    uVar115 = (ushort)((short)uVar115 < sVar61) * sVar61 |
                              ((short)uVar115 >= sVar61) * uVar115;
                    uVar116 = (ushort)((short)uVar116 < sVar62) * sVar62 |
                              ((short)uVar116 >= sVar62) * uVar116;
                    uVar83 = (ushort)(sVar28 < sVar29) * sVar29 |
                             (ushort)(sVar28 >= sVar29) * sVar28;
                    uVar88 = (ushort)(sVar63 < sVar71) * sVar71 |
                             (ushort)(sVar63 >= sVar71) * sVar63;
                    uVar89 = (ushort)(sVar64 < sVar72) * sVar72 |
                             (ushort)(sVar64 >= sVar72) * sVar64;
                    uVar90 = (ushort)(sVar65 < sVar103) * sVar103 |
                             (ushort)(sVar65 >= sVar103) * sVar65;
                    uVar91 = (ushort)(sVar67 < sVar106) * sVar106 |
                             (ushort)(sVar67 >= sVar106) * sVar67;
                    uVar93 = (ushort)(sVar68 < sVar108) * sVar108 |
                             (ushort)(sVar68 >= sVar108) * sVar68;
                    uVar94 = (ushort)(sVar69 < sVar110) * sVar110 |
                             (ushort)(sVar69 >= sVar110) * sVar69;
                    uVar95 = (ushort)(sVar70 < sVar112) * sVar112 |
                             (ushort)(sVar70 >= sVar112) * sVar70;
                    auVar51._0_2_ =
                         ((short)uVar83 < (short)uVar104) * uVar104 |
                         ((short)uVar83 >= (short)uVar104) * uVar83;
                    auVar51._2_2_ =
                         ((short)uVar88 < (short)uVar107) * uVar107 |
                         ((short)uVar88 >= (short)uVar107) * uVar88;
                    auVar51._4_2_ =
                         ((short)uVar89 < (short)uVar109) * uVar109 |
                         ((short)uVar89 >= (short)uVar109) * uVar89;
                    auVar51._6_2_ =
                         ((short)uVar90 < (short)uVar111) * uVar111 |
                         ((short)uVar90 >= (short)uVar111) * uVar90;
                    auVar51._8_2_ =
                         ((short)uVar91 < (short)uVar113) * uVar113 |
                         ((short)uVar91 >= (short)uVar113) * uVar91;
                    auVar51._10_2_ =
                         ((short)uVar93 < (short)uVar114) * uVar114 |
                         ((short)uVar93 >= (short)uVar114) * uVar93;
                    auVar51._12_2_ =
                         ((short)uVar94 < (short)uVar115) * uVar115 |
                         ((short)uVar94 >= (short)uVar115) * uVar94;
                    auVar51._14_2_ =
                         ((short)uVar95 < (short)uVar116) * uVar116 |
                         ((short)uVar95 >= (short)uVar116) * uVar95;
                    lVar43 = lVar43 + 0x10;
                    lVar23 = lVar23 + uVar34 * 4;
                  } while (lVar20 != lVar43);
                  sVar45 = (short)(*palVar26)[0];
                  sVar58 = *(short *)((long)*palVar26 + 2);
                  sVar59 = *(short *)((long)*palVar26 + 4);
                  sVar60 = *(short *)((long)*palVar26 + 6);
                  sVar61 = (short)(*palVar26)[1];
                  sVar62 = *(short *)((long)*palVar26 + 10);
                  sVar63 = *(short *)((long)*palVar26 + 0xc);
                  sVar64 = *(short *)((long)*palVar26 + 0xe);
                  local_a8 = auVar117._0_2_;
                  sStack_a6 = auVar117._2_2_;
                  sStack_a4 = auVar117._4_2_;
                  sStack_a2 = auVar117._6_2_;
                  sStack_a0 = auVar117._8_2_;
                  sStack_9e = auVar117._10_2_;
                  sStack_9c = auVar117._12_2_;
                  sStack_9a = auVar117._14_2_;
                  auVar57._0_2_ = -(ushort)(local_a8 < sVar45);
                  auVar57._2_2_ = -(ushort)(sStack_a6 < sVar58);
                  auVar57._4_2_ = -(ushort)(sStack_a4 < sVar59);
                  auVar57._6_2_ = -(ushort)(sStack_a2 < sVar60);
                  auVar57._8_2_ = -(ushort)(sStack_a0 < sVar61);
                  auVar57._10_2_ = -(ushort)(sStack_9e < sVar62);
                  auVar57._12_2_ = -(ushort)(sStack_9c < sVar63);
                  auVar57._14_2_ = -(ushort)(sStack_9a < sVar64);
                  auVar79 = pblendvb(auVar79,(undefined1  [16])b_03[uVar41],auVar57);
                  auVar50 = pblendvb(auVar50,(undefined1  [16])b_04[uVar41],auVar57);
                  auVar74 = pblendvb(auVar74,(undefined1  [16])b_05[uVar41],auVar57);
                  sVar44 = auVar74._14_2_;
                  auVar12._2_2_ = -(ushort)(sStack_1e6 == 6);
                  auVar12._0_2_ = -(ushort)(local_1e8 == 7);
                  auVar12._4_2_ = -(ushort)(local_1e8 == 5);
                  auVar12._6_2_ = -(ushort)(sStack_1e6 == 4);
                  auVar12._8_2_ = -(ushort)(local_1e8 == 3);
                  auVar12._10_2_ = -(ushort)(sStack_1e6 == 2);
                  auVar12._12_2_ = -(ushort)(local_1e8 == 1);
                  auVar12._14_2_ = -(ushort)(sStack_1e6 == 0);
                  auVar57 = auVar57 & auVar12;
                  local_208 = (int)uVar33;
                  if ((((((((((((((((auVar57 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar57 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar57 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar57 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar57 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar57 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar57 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar57 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar57 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar57 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar57 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar57 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar57 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar57[0xf] < '\0') {
                    local_334 = local_208;
                  }
                  auVar117._0_2_ =
                       (ushort)(local_a8 < sVar45) * sVar45 |
                       (ushort)(local_a8 >= sVar45) * local_a8;
                  auVar117._2_2_ =
                       (ushort)(sStack_a6 < sVar58) * sVar58 |
                       (ushort)(sStack_a6 >= sVar58) * sStack_a6;
                  auVar117._4_2_ =
                       (ushort)(sStack_a4 < sVar59) * sVar59 |
                       (ushort)(sStack_a4 >= sVar59) * sStack_a4;
                  auVar117._6_2_ =
                       (ushort)(sStack_a2 < sVar60) * sVar60 |
                       (ushort)(sStack_a2 >= sVar60) * sStack_a2;
                  auVar117._8_2_ =
                       (ushort)(sStack_a0 < sVar61) * sVar61 |
                       (ushort)(sStack_a0 >= sVar61) * sStack_a0;
                  auVar117._10_2_ =
                       (ushort)(sStack_9e < sVar62) * sVar62 |
                       (ushort)(sStack_9e >= sVar62) * sStack_9e;
                  auVar117._12_2_ =
                       (ushort)(sStack_9c < sVar63) * sVar63 |
                       (ushort)(sStack_9c >= sVar63) * sStack_9c;
                  auVar117._14_2_ =
                       (ushort)(sStack_9a < sVar64) * sVar64 |
                       (ushort)(sStack_9a >= sVar64) * sStack_9a;
                  local_210 = local_210 + 4;
                  uVar33 = uVar66;
                } while (uVar66 != uVar82);
                if (s2_end == 0) {
                  sVar45 = 0;
                  sVar58 = 0;
                  sVar44 = 0;
                }
                else {
                  if (iVar14 < 7) {
                    auVar48 = auVar117;
                    uVar17 = 1;
                    if (1 < (int)uVar16) {
                      uVar17 = uVar16;
                    }
                    do {
                      auVar73._0_8_ = auVar48._0_8_ << 0x10;
                      auVar73._8_8_ = auVar48._8_8_ << 0x10 | auVar48._0_8_ >> 0x30;
                      auVar117._14_2_ = auVar48._12_2_;
                      lVar22 = auVar79._8_8_;
                      uVar34 = auVar79._0_8_;
                      auVar79._0_8_ = uVar34 << 0x10;
                      auVar79._8_8_ = lVar22 << 0x10 | uVar34 >> 0x30;
                      lVar22 = auVar50._8_8_;
                      uVar34 = auVar50._0_8_;
                      auVar50._0_8_ = uVar34 << 0x10;
                      auVar50._8_8_ = lVar22 << 0x10 | uVar34 >> 0x30;
                      auVar49._0_8_ = auVar74._0_8_ << 0x10;
                      auVar49._8_8_ = auVar74._8_8_ << 0x10 | auVar74._0_8_ >> 0x30;
                      sVar44 = auVar74._12_2_;
                      uVar17 = uVar17 - 1;
                      auVar74 = auVar49;
                      auVar48 = auVar73;
                    } while (uVar17 != 0);
                  }
                  c[1]._0_4_ = (uint)auVar117._14_2_;
                  sVar45 = (short)(auVar79._8_8_ >> 0x30);
                  sVar58 = (short)(auVar50._8_8_ >> 0x30);
                }
                sVar59 = (short)(uint)c[1];
                iVar21 = iVar13;
                if ((s1_end != 0) && ((uVar92 & 0x7ffffff8) != 0)) {
                  uVar34 = 0;
                  do {
                    iVar35 = ((uint)uVar34 & 7) * uVar30 + ((uint)(uVar34 >> 3) & 0x1fffffff);
                    if (iVar35 < (int)uVar18) {
                      auVar117._14_2_ = *(ushort *)((long)*ptr + uVar34 * 2);
                      iVar24 = iVar15;
                      uVar17 = (uint)auVar117._14_2_;
                      if (((short)(ushort)(uint)c[1] < (short)auVar117._14_2_) ||
                         (((auVar117._14_2_ == (ushort)(uint)c[1] && (local_334 == iVar15)) &&
                          (iVar24 = local_334, uVar17 = (uint)c[1], iVar35 < iVar21)))) {
                        c[1]._0_4_ = uVar17;
                        sVar45 = *(short *)((long)*b_03 + uVar34 * 2);
                        sVar58 = *(short *)((long)*b_04 + uVar34 * 2);
                        sVar44 = *(short *)((long)*b_05 + uVar34 * 2);
                        local_334 = iVar24;
                        iVar21 = iVar35;
                      }
                    }
                    sVar59 = (short)(uint)c[1];
                    uVar34 = uVar34 + 1;
                  } while ((uVar30 & 0xfffffff) << 3 != (int)uVar34);
                }
                if (s2_end == 0 && s1_end == 0) {
                  uVar34 = ptr[uVar41][0];
                  uVar92 = ptr[uVar41][1];
                  uVar31 = b_03[uVar41][0];
                  uVar82 = b_03[uVar41][1];
                  uVar33 = b_04[uVar41][0];
                  auVar50._8_8_ = b_04[uVar41][1];
                  auVar79._8_8_ = b_05[uVar41][0];
                  uVar66 = b_05[uVar41][1];
                  if (iVar14 < 7) {
                    uVar18 = 1;
                    if (1 < (int)uVar16) {
                      uVar18 = uVar16;
                    }
                    do {
                      uVar92 = uVar92 << 0x10 | uVar34 >> 0x30;
                      uVar82 = uVar82 << 0x10 | uVar31 >> 0x30;
                      auVar50._8_8_ = auVar50._8_8_ << 0x10 | uVar33 >> 0x30;
                      uVar66 = uVar66 << 0x10 | auVar79._8_8_ >> 0x30;
                      uVar18 = uVar18 - 1;
                      uVar34 = uVar34 << 0x10;
                      uVar31 = uVar31 << 0x10;
                      uVar33 = uVar33 << 0x10;
                      auVar79._8_8_ = auVar79._8_8_ << 0x10;
                    } while (uVar18 != 0);
                  }
                  sVar59 = (short)(uVar92 >> 0x30);
                  sVar45 = (short)(uVar82 >> 0x30);
                  sVar58 = (short)(auVar50._8_8_ >> 0x30);
                  sVar44 = (short)(uVar66 >> 0x30);
                  local_334 = iVar15;
                  iVar21 = iVar13;
                }
                auVar78._0_2_ = -(ushort)((short)uVar129 < local_1f8);
                auVar78._2_2_ = -(ushort)((short)uVar130 < sStack_1f6);
                auVar78._4_2_ = -(ushort)((short)uVar131 < local_1f8);
                auVar78._6_2_ = -(ushort)((short)uVar132 < sStack_1f6);
                auVar78._8_2_ = -(ushort)((short)uVar133 < local_1f8);
                auVar78._10_2_ = -(ushort)((short)uVar134 < sStack_1f6);
                auVar78._12_2_ = -(ushort)((short)uVar135 < local_1f8);
                auVar78._14_2_ = -(ushort)((short)uVar136 < sStack_1f6);
                auVar98._0_2_ = -(ushort)((short)local_f8 < (short)auVar51._0_2_);
                auVar98._2_2_ = -(ushort)((short)uStack_f6 < (short)auVar51._2_2_);
                auVar98._4_2_ = -(ushort)((short)local_f8 < (short)auVar51._4_2_);
                auVar98._6_2_ = -(ushort)((short)uStack_f6 < (short)auVar51._6_2_);
                auVar98._8_2_ = -(ushort)((short)local_f8 < (short)auVar51._8_2_);
                auVar98._10_2_ = -(ushort)((short)uStack_f6 < (short)auVar51._10_2_);
                auVar98._12_2_ = -(ushort)((short)local_f8 < (short)auVar51._12_2_);
                auVar98._14_2_ = -(ushort)((short)uStack_f6 < (short)auVar51._14_2_);
                auVar98 = auVar98 | auVar78;
                if ((((((((((((((((auVar98 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar98 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar98 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar98 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar98 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar98 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar98 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar98 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar98 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar98 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar98 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar98 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar98[0xf] < '\0') {
                  *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
                  sVar59 = 0;
                  sVar45 = 0;
                  sVar58 = 0;
                  sVar44 = 0;
                  local_334 = 0;
                  iVar21 = 0;
                }
                ppVar19->score = (int)sVar59;
                ppVar19->end_query = iVar21;
                ppVar19->end_ref = local_334;
                *(int *)(ppVar19->field_4).extra = (int)sVar45;
                ((ppVar19->field_4).stats)->similar = (int)sVar58;
                ((ppVar19->field_4).stats)->length = (int)sVar44;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar19;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            cond_max = _mm_cmpgt_epi16(vH, vMaxH);
            vMaxH = _mm_max_epi16(vMaxH, vH);
            vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
            vMaxM = _mm_slli_si128(vMaxM, 2);
            vMaxS = _mm_slli_si128(vMaxS, 2);
            vMaxL = _mm_slli_si128(vMaxL, 2);
        }
        end_query = s1Len-1;
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        matches = (int16_t) _mm_extract_epi16(vMaxM, 7);
        similar = (int16_t) _mm_extract_epi16(vMaxS, 7);
        length = (int16_t) _mm_extract_epi16(vMaxL, 7);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int16_t *m = (int16_t*)pvHM;
        int16_t *s = (int16_t*)pvHS;
        int16_t *l = (int16_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}